

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  U32 *pUVar2;
  ulong uVar3;
  U32 UVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  BYTE *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  U32 windowLow_3;
  U32 repCurrent;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t ofbCandidate_2;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  U32 windowLow_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t ofbCandidate_1;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  U32 windowLow_1;
  size_t step;
  size_t ml2;
  size_t ofbCandidate;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 windowLow;
  U32 curr;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  U32 windowLog;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  U32 in_stack_fffffffffffff8f8;
  U32 in_stack_fffffffffffff8fc;
  BYTE *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  U32 in_stack_fffffffffffff90c;
  ZSTD_matchState_t *in_stack_fffffffffffff910;
  BYTE *in_stack_fffffffffffff918;
  uint in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  uint in_stack_fffffffffffff928;
  uint in_stack_fffffffffffff92c;
  BYTE *in_stack_fffffffffffff930;
  BYTE *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  ZSTD_matchState_t *in_stack_fffffffffffff9c0;
  BYTE *local_638;
  ZSTD_matchState_t *local_628;
  BYTE *local_598;
  ZSTD_matchState_t *local_588;
  BYTE *local_510;
  ZSTD_matchState_t *local_500;
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  BYTE *local_460;
  ulong local_440;
  int local_438;
  int local_434;
  ulong local_430;
  BYTE *local_428;
  void *local_420;
  ZSTD_matchState_t *local_418;
  uint local_410;
  U32 local_40c;
  int local_408;
  int local_404;
  size_t local_400;
  ulong local_3f8;
  int local_3f0;
  int local_3ec;
  ulong local_3e8;
  BYTE *local_3e0;
  void *local_3d8;
  ZSTD_matchState_t *local_3d0;
  uint local_3c8;
  U32 local_3c4;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  BYTE *local_3a8;
  void *local_3a0;
  ZSTD_matchState_t *local_398;
  uint local_38c;
  U32 local_388;
  U32 local_384;
  BYTE *local_380;
  ulong local_378;
  ulong local_370;
  uint local_364;
  uint local_360;
  uint local_35c;
  uint local_358;
  uint local_354;
  BYTE *local_350;
  BYTE *local_348;
  ZSTD_matchState_t *local_340;
  BYTE *local_338;
  uint local_32c;
  ZSTD_matchState_t *local_328;
  BYTE *local_320;
  BYTE *local_318;
  BYTE *local_310;
  BYTE *local_308;
  int local_2f8;
  int local_2f4;
  uint *local_2e0;
  long *local_2d8;
  ZSTD_matchState_t *local_2d0;
  int local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  U32 local_264;
  BYTE *local_260;
  U32 *local_258;
  BYTE *local_250;
  uint local_244;
  uint local_240;
  uint local_23c;
  ZSTD_matchState_t *local_238;
  ZSTD_matchState_t *local_230;
  U64 local_228;
  uint local_220;
  int local_21c;
  long local_218;
  size_t local_210;
  uint local_1e8;
  int local_1e4;
  BYTE *local_1e0;
  U32 *local_1d8;
  undefined4 local_1b8;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  ulong *local_1a8;
  BYTE *local_1a0;
  BYTE *local_198;
  ZSTD_matchState_t *local_190;
  ulong local_188;
  undefined4 local_180;
  int local_17c;
  uint local_178;
  uint local_174;
  ulong *local_170;
  BYTE *local_168;
  BYTE *local_160;
  ZSTD_matchState_t *local_158;
  size_t local_150;
  undefined4 local_148;
  int local_144;
  uint local_140;
  uint local_13c;
  ulong *local_138;
  BYTE *local_130;
  BYTE *local_128;
  ZSTD_matchState_t *local_120;
  ulong local_118;
  ulong local_110;
  BYTE *local_108;
  BYTE *local_100;
  ulong local_f8;
  undefined4 local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  ulong local_d8;
  long *local_d0;
  ulong local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  ulong local_b0;
  undefined4 local_a4;
  BYTE *local_a0;
  BYTE *local_98;
  ulong local_90;
  long *local_88;
  void *local_80;
  void *local_78;
  BYTE *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  BYTE *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  BYTE *local_30;
  long local_28;
  undefined4 local_1c;
  long local_18;
  BYTE *local_10;
  void *local_8;
  
  local_318 = in_RCX + in_R8;
  local_320 = local_318 + -8;
  local_328 = (ZSTD_matchState_t *)(in_RDI->window).base;
  local_32c = (in_RDI->window).dictLimit;
  local_338 = (BYTE *)((long)local_328->hashCache + ((ulong)local_32c - 0x40));
  local_340 = (ZSTD_matchState_t *)(in_RDI->window).dictBase;
  local_348 = (BYTE *)((long)local_340->hashCache + ((ulong)local_32c - 0x40));
  local_350 = (BYTE *)((long)local_340->hashCache + ((ulong)(in_RDI->window).lowLimit - 0x40));
  local_354 = (in_RDI->cParams).windowLog;
  if ((in_RDI->cParams).minMatch < 6) {
    local_4cc = (in_RDI->cParams).minMatch;
  }
  else {
    local_4cc = 6;
  }
  if (local_4cc < 4) {
    local_4d0 = 4;
  }
  else {
    if ((in_RDI->cParams).minMatch < 6) {
      local_4d4 = (in_RDI->cParams).minMatch;
    }
    else {
      local_4d4 = 6;
    }
    local_4d0 = local_4d4;
  }
  if ((in_RDI->cParams).searchLog < 6) {
    local_4d8 = (in_RDI->cParams).searchLog;
  }
  else {
    local_4d8 = 6;
  }
  if (local_4d8 < 4) {
    local_4dc = 4;
  }
  else {
    if ((in_RDI->cParams).searchLog < 6) {
      local_4e0 = (in_RDI->cParams).searchLog;
    }
    else {
      local_4e0 = 6;
    }
    local_4dc = local_4e0;
  }
  local_360 = *in_RDX;
  local_364 = in_RDX[1];
  in_RDI->lazySkipping = 0;
  local_308 = in_RCX + (int)(uint)(in_RCX == local_338);
  local_2f4 = 0;
  local_2f8 = 2;
  local_358 = local_4d0;
  local_35c = local_4dc;
  local_310 = in_RCX;
  local_2e0 = in_RDX;
  local_2d8 = in_RSI;
  local_2d0 = in_RDI;
LAB_0093f220:
  do {
    if (local_320 <= local_308) {
      *local_2e0 = local_360;
      local_2e0[1] = local_364;
      return (long)local_318 - (long)local_310;
    }
    local_370 = 0;
    local_378 = 1;
    local_380 = local_308 + 1;
    local_384 = (int)local_308 - (int)local_328;
    local_388 = ZSTD_getLowestMatchIndex(local_2d0,local_384 + 1,local_354);
    local_38c = (local_384 + 1) - local_360;
    if (local_38c < local_32c) {
      local_500 = local_340;
    }
    else {
      local_500 = local_328;
    }
    local_398 = local_500;
    local_3a0 = (void *)((long)local_500->hashCache + ((ulong)local_38c - 0x40));
    if ((local_32c - 1) - local_38c < 3 || (local_384 + 1) - local_388 < local_360) {
LAB_0093f42f:
      local_3b0 = 999999999;
      local_120 = local_2d0;
      local_128 = local_308;
      local_130 = local_318;
      local_138 = &local_3b0;
      local_13c = local_358;
      local_140 = local_35c;
      local_144 = local_2f4;
      local_148 = 1;
      if (local_2f4 == 0) {
        if (local_358 == 4) {
          local_118 = ZSTD_HcFindBestMatch_extDict_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        }
        else if (local_358 == 5) {
          local_118 = ZSTD_HcFindBestMatch_extDict_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        }
        else if (local_358 == 6) {
          local_118 = ZSTD_HcFindBestMatch_extDict_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        }
      }
      else if (local_2f4 == 1) {
        if (local_358 == 4) {
          local_118 = ZSTD_BtFindBestMatch_extDict_4
                                (in_stack_fffffffffffff910,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                  in_stack_fffffffffffff908),
                                 in_stack_fffffffffffff900,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        }
        else if (local_358 == 5) {
          local_118 = ZSTD_BtFindBestMatch_extDict_5
                                (in_stack_fffffffffffff910,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                  in_stack_fffffffffffff908),
                                 in_stack_fffffffffffff900,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        }
        else if (local_358 == 6) {
          local_118 = ZSTD_BtFindBestMatch_extDict_6
                                (in_stack_fffffffffffff910,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                  in_stack_fffffffffffff908),
                                 in_stack_fffffffffffff900,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        }
      }
      else if (local_358 == 4) {
        if (local_35c == 4) {
          local_118 = ZSTD_RowFindBestMatch_extDict_4_4
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else if (local_35c == 5) {
          local_118 = ZSTD_RowFindBestMatch_extDict_4_5
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          local_118 = ZSTD_RowFindBestMatch_extDict_4_6
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
      }
      else if (local_358 == 5) {
        if (local_35c == 4) {
          local_118 = ZSTD_RowFindBestMatch_extDict_5_4
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else if (local_35c == 5) {
          local_118 = ZSTD_RowFindBestMatch_extDict_5_5
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          local_118 = ZSTD_RowFindBestMatch_extDict_5_6
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
      }
      else if (local_358 == 6) {
        if (local_35c == 4) {
          local_118 = ZSTD_RowFindBestMatch_extDict_6_4
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else if (local_35c == 5) {
          local_118 = ZSTD_RowFindBestMatch_extDict_6_5
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          local_118 = ZSTD_RowFindBestMatch_extDict_6_6
                                (in_stack_fffffffffffff9c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
      }
      local_3b8 = local_118;
      if (local_370 < local_118) {
        local_370 = local_118;
        local_380 = local_308;
        local_378 = local_3b0;
      }
      if (local_370 < 4) {
        local_3c0 = (ulong)((long)local_308 - (long)local_310) >> 8;
        local_308 = local_308 + local_3c0 + 1;
        local_2d0->lazySkipping = (uint)(8 < local_3c0);
        goto LAB_0093f220;
      }
      if (local_2f8 != 0) {
        while (local_308 < local_320) {
          local_308 = local_308 + 1;
          local_384 = local_384 + 1;
          if (local_378 != 0) {
            local_3c4 = ZSTD_getLowestMatchIndex(local_2d0,local_384,local_354);
            local_3c8 = local_384 - local_360;
            if (local_3c8 < local_32c) {
              local_588 = local_340;
            }
            else {
              local_588 = local_328;
            }
            local_3d0 = local_588;
            local_3d8 = (void *)((long)local_588->hashCache + ((ulong)local_3c8 - 0x40));
            if (2 < (local_32c - 1) - local_3c8 && local_360 <= local_384 - local_3c4) {
              UVar4 = MEM_read32(local_308);
              UVar5 = MEM_read32(local_3d8);
              if (UVar4 == UVar5) {
                if (local_3c8 < local_32c) {
                  local_598 = local_348;
                }
                else {
                  local_598 = local_318;
                }
                local_3e0 = local_598;
                sVar8 = ZSTD_count_2segments
                                  (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff92c,
                                                    in_stack_fffffffffffff928),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff924,
                                                    in_stack_fffffffffffff920),
                                   in_stack_fffffffffffff918);
                local_3e8 = sVar8 + 4;
                local_3ec = (int)local_3e8 * 3;
                iVar1 = (int)local_370;
                uVar7 = ZSTD_highbit32(0);
                local_3f0 = (iVar1 * 3 - uVar7) + 1;
                if ((3 < local_3e8) && (local_3f0 < local_3ec)) {
                  local_370 = local_3e8;
                  local_378 = 1;
                  local_380 = local_308;
                }
              }
            }
          }
          local_3f8 = 999999999;
          local_158 = local_2d0;
          local_160 = local_308;
          local_168 = local_318;
          local_170 = &local_3f8;
          local_174 = local_358;
          local_178 = local_35c;
          local_17c = local_2f4;
          local_180 = 1;
          if (local_2f4 == 0) {
            if (local_358 == 4) {
              local_150 = ZSTD_HcFindBestMatch_extDict_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                      in_stack_fffffffffffff970),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                      in_stack_fffffffffffff968),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            }
            else if (local_358 == 5) {
              local_150 = ZSTD_HcFindBestMatch_extDict_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                      in_stack_fffffffffffff970),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                      in_stack_fffffffffffff968),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            }
            else if (local_358 == 6) {
              local_150 = ZSTD_HcFindBestMatch_extDict_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                      in_stack_fffffffffffff970),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                      in_stack_fffffffffffff968),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            }
          }
          else if (local_2f4 == 1) {
            if (local_358 == 4) {
              local_150 = ZSTD_BtFindBestMatch_extDict_4
                                    (in_stack_fffffffffffff910,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                      in_stack_fffffffffffff908),
                                     in_stack_fffffffffffff900,
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
            }
            else if (local_358 == 5) {
              local_150 = ZSTD_BtFindBestMatch_extDict_5
                                    (in_stack_fffffffffffff910,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                      in_stack_fffffffffffff908),
                                     in_stack_fffffffffffff900,
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
            }
            else if (local_358 == 6) {
              local_150 = ZSTD_BtFindBestMatch_extDict_6
                                    (in_stack_fffffffffffff910,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                      in_stack_fffffffffffff908),
                                     in_stack_fffffffffffff900,
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
            }
          }
          else if (local_358 == 4) {
            if (local_35c == 4) {
              local_150 = ZSTD_RowFindBestMatch_extDict_4_4
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else if (local_35c == 5) {
              local_150 = ZSTD_RowFindBestMatch_extDict_4_5
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else {
              local_150 = ZSTD_RowFindBestMatch_extDict_4_6
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
          }
          else if (local_358 == 5) {
            if (local_35c == 4) {
              local_150 = ZSTD_RowFindBestMatch_extDict_5_4
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else if (local_35c == 5) {
              local_150 = ZSTD_RowFindBestMatch_extDict_5_5
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else {
              local_150 = ZSTD_RowFindBestMatch_extDict_5_6
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
          }
          else if (local_358 == 6) {
            if (local_35c == 4) {
              local_150 = ZSTD_RowFindBestMatch_extDict_6_4
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else if (local_35c == 5) {
              local_150 = ZSTD_RowFindBestMatch_extDict_6_5
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else {
              local_150 = ZSTD_RowFindBestMatch_extDict_6_6
                                    (in_stack_fffffffffffff9c0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                      in_stack_fffffffffffff9b8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                      in_stack_fffffffffffff9b0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
          }
          local_400 = local_150;
          lVar9 = local_150 << 2;
          uVar7 = ZSTD_highbit32(0);
          local_404 = (int)lVar9 - uVar7;
          lVar9 = local_370 << 2;
          uVar7 = ZSTD_highbit32(0);
          local_408 = ((int)lVar9 - uVar7) + 4;
          if ((local_400 < 4) || (local_404 <= local_408)) {
            if ((local_2f8 != 2) || (local_320 <= local_308)) break;
            local_308 = local_308 + 1;
            local_384 = local_384 + 1;
            if (local_378 != 0) {
              local_40c = ZSTD_getLowestMatchIndex(local_2d0,local_384,local_354);
              local_410 = local_384 - local_360;
              if (local_410 < local_32c) {
                local_628 = local_340;
              }
              else {
                local_628 = local_328;
              }
              local_418 = local_628;
              local_420 = (void *)((long)local_628->hashCache + ((ulong)local_410 - 0x40));
              if (2 < (local_32c - 1) - local_410 && local_360 <= local_384 - local_40c) {
                UVar4 = MEM_read32(local_308);
                UVar5 = MEM_read32(local_420);
                if (UVar4 == UVar5) {
                  if (local_410 < local_32c) {
                    local_638 = local_348;
                  }
                  else {
                    local_638 = local_318;
                  }
                  local_428 = local_638;
                  sVar8 = ZSTD_count_2segments
                                    (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff92c,
                                                      in_stack_fffffffffffff928),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff924,
                                                      in_stack_fffffffffffff920),
                                     in_stack_fffffffffffff918);
                  local_430 = sVar8 + 4;
                  local_434 = (int)local_430 * 4;
                  in_stack_fffffffffffff9c0 = (ZSTD_matchState_t *)(local_370 << 2);
                  uVar7 = ZSTD_highbit32(0);
                  local_438 = ((int)in_stack_fffffffffffff9c0 - uVar7) + 1;
                  if ((3 < local_430) && (local_438 < local_434)) {
                    local_370 = local_430;
                    local_378 = 1;
                    local_380 = local_308;
                  }
                }
              }
            }
            local_440 = 999999999;
            local_190 = local_2d0;
            local_198 = local_308;
            local_1a0 = local_318;
            local_1a8 = &local_440;
            local_1ac = local_358;
            local_1b0 = local_35c;
            local_1b4 = local_2f4;
            local_1b8 = 1;
            if (local_2f4 == 0) {
              if (local_358 == 4) {
                local_188 = ZSTD_HcFindBestMatch_extDict_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                         in_stack_fffffffffffff970),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                        in_stack_fffffffffffff968),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960)
                                      );
              }
              else if (local_358 == 5) {
                local_188 = ZSTD_HcFindBestMatch_extDict_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                         in_stack_fffffffffffff970),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                        in_stack_fffffffffffff968),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960)
                                      );
              }
              else if (local_358 == 6) {
                local_188 = ZSTD_HcFindBestMatch_extDict_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff974,
                                                         in_stack_fffffffffffff970),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff96c,
                                                        in_stack_fffffffffffff968),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960)
                                      );
              }
            }
            else if (local_2f4 == 1) {
              if (local_358 == 4) {
                local_188 = ZSTD_BtFindBestMatch_extDict_4
                                      (in_stack_fffffffffffff910,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                        in_stack_fffffffffffff908),
                                       in_stack_fffffffffffff900,
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8)
                                      );
              }
              else if (local_358 == 5) {
                local_188 = ZSTD_BtFindBestMatch_extDict_5
                                      (in_stack_fffffffffffff910,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                        in_stack_fffffffffffff908),
                                       in_stack_fffffffffffff900,
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8)
                                      );
              }
              else if (local_358 == 6) {
                local_188 = ZSTD_BtFindBestMatch_extDict_6
                                      (in_stack_fffffffffffff910,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff90c,
                                                        in_stack_fffffffffffff908),
                                       in_stack_fffffffffffff900,
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8)
                                      );
              }
            }
            else if (local_358 == 4) {
              if (local_35c == 4) {
                local_188 = ZSTD_RowFindBestMatch_extDict_4_4
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else if (local_35c == 5) {
                local_188 = ZSTD_RowFindBestMatch_extDict_4_5
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else {
                local_188 = ZSTD_RowFindBestMatch_extDict_4_6
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
            }
            else if (local_358 == 5) {
              if (local_35c == 4) {
                local_188 = ZSTD_RowFindBestMatch_extDict_5_4
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else if (local_35c == 5) {
                local_188 = ZSTD_RowFindBestMatch_extDict_5_5
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else {
                local_188 = ZSTD_RowFindBestMatch_extDict_5_6
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
            }
            else if (local_358 == 6) {
              if (local_35c == 4) {
                local_188 = ZSTD_RowFindBestMatch_extDict_6_4
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else if (local_35c == 5) {
                local_188 = ZSTD_RowFindBestMatch_extDict_6_5
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
              else {
                local_188 = ZSTD_RowFindBestMatch_extDict_6_6
                                      (in_stack_fffffffffffff9c0,
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,
                                                        in_stack_fffffffffffff9b8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff9b4,
                                                        in_stack_fffffffffffff9b0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                      );
              }
            }
            uVar3 = local_188;
            lVar9 = local_188 << 2;
            uVar7 = ZSTD_highbit32(0);
            lVar10 = local_370 << 2;
            uVar6 = ZSTD_highbit32(0);
            if ((uVar3 < 4) || ((int)((int)lVar9 - uVar7) <= (int)(((int)lVar10 - uVar6) + 7)))
            break;
            local_370 = uVar3;
            local_378 = local_440;
            local_380 = local_308;
          }
          else {
            local_370 = local_400;
            local_378 = local_3f8;
            local_380 = local_308;
          }
        }
      }
      if (3 < local_378) {
        uVar7 = ((int)local_380 - (int)local_328) - ((int)local_378 + -3);
        if (uVar7 < local_32c) {
          local_460 = (BYTE *)((long)local_340->hashCache + ((ulong)uVar7 - 0x40));
          in_stack_fffffffffffff938 = local_460;
          in_stack_fffffffffffff930 = local_350;
        }
        else {
          local_460 = (BYTE *)((long)local_328->hashCache + ((ulong)uVar7 - 0x40));
          in_stack_fffffffffffff938 = local_460;
          in_stack_fffffffffffff930 = local_338;
        }
        while( true ) {
          uVar7 = in_stack_fffffffffffff92c & 0xffffff;
          if ((local_310 < local_380) &&
             (uVar7 = in_stack_fffffffffffff92c & 0xffffff, in_stack_fffffffffffff930 < local_460))
          {
            uVar7 = CONCAT13(local_380[-1] == local_460[-1],(int3)in_stack_fffffffffffff92c);
          }
          in_stack_fffffffffffff92c = uVar7;
          if ((char)(uVar7 >> 0x18) == '\0') break;
          local_380 = local_380 + -1;
          local_460 = local_460 + -1;
          local_370 = local_370 + 1;
        }
        local_364 = local_360;
        local_360 = (int)local_378 - 3;
      }
    }
    else {
      UVar4 = MEM_read32(local_308 + 1);
      UVar5 = MEM_read32(local_3a0);
      if (UVar4 != UVar5) goto LAB_0093f42f;
      if (local_38c < local_32c) {
        local_510 = local_348;
      }
      else {
        local_510 = local_318;
      }
      local_3a8 = local_510;
      sVar8 = ZSTD_count_2segments
                        (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (BYTE *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         in_stack_fffffffffffff918);
      local_370 = sVar8 + 4;
      if (local_2f8 != 0) goto LAB_0093f42f;
    }
    local_90 = (long)local_380 - (long)local_310;
    local_88 = local_2d8;
    local_98 = local_310;
    local_a0 = local_318;
    local_a4 = (undefined4)local_378;
    local_b0 = local_370;
    local_b8 = local_318 + -0x20;
    local_c0 = local_310 + local_90;
    if (local_b8 < local_c0) {
      ZSTD_safecopyLiterals
                ((BYTE *)in_stack_fffffffffffff910,
                 (BYTE *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                 in_stack_fffffffffffff900,
                 (BYTE *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    }
    else {
      ZSTD_copy16((void *)local_2d8[3],local_310);
      if (0x10 < local_90) {
        local_78 = (void *)(local_88[3] + 0x10);
        local_70 = local_98 + 0x10;
        local_58 = local_90 - 0x10;
        local_5c = 0;
        local_68 = (long)local_78 - (long)local_70;
        local_80 = (void *)((long)local_78 + local_58);
        local_50 = local_70;
        local_48 = local_78;
        ZSTD_copy16(local_78,local_70);
        if (0x10 < local_58) {
          local_78 = (void *)((long)local_78 + 0x10);
          local_70 = local_70 + 0x10;
          do {
            ZSTD_copy16(local_78,local_70);
            local_78 = (void *)((long)local_78 + 0x10);
            local_70 = local_70 + 0x10;
            ZSTD_copy16(local_78,local_70);
            local_78 = (void *)((long)local_78 + 0x10);
            local_70 = local_70 + 0x10;
          } while (local_78 < local_80);
        }
      }
    }
    local_88[3] = local_90 + local_88[3];
    if (0xffff < local_90) {
      *(undefined4 *)(local_88 + 9) = 1;
      *(int *)((long)local_88 + 0x4c) = (int)(local_88[1] - *local_88 >> 3);
    }
    *(short *)(local_88[1] + 4) = (short)local_90;
    *(undefined4 *)local_88[1] = local_a4;
    local_c8 = local_b0 - 3;
    if (0xffff < local_c8) {
      *(undefined4 *)(local_88 + 9) = 2;
      *(int *)((long)local_88 + 0x4c) = (int)(local_88[1] - *local_88 >> 3);
    }
    *(short *)(local_88[1] + 6) = (short)local_c8;
    local_88[1] = local_88[1] + 8;
    local_310 = local_380 + local_370;
    local_308 = local_310;
    if (local_2d0->lazySkipping != 0) {
      if (local_2f4 == 2) {
        in_stack_fffffffffffff924 = local_2d0->nextToUpdate;
        local_230 = local_2d0;
        local_238 = local_328;
        local_23c = local_35c;
        local_240 = local_358;
        local_250 = local_320;
        local_258 = local_2d0->hashTable;
        local_260 = local_2d0->tagTable;
        local_264 = local_2d0->rowHashLog;
        if (local_320 <
            (BYTE *)((long)local_328->hashCache + ((ulong)in_stack_fffffffffffff924 - 0x40))) {
          in_stack_fffffffffffff928 = 0;
        }
        else {
          in_stack_fffffffffffff928 =
               ((int)local_320 - ((int)local_328 + in_stack_fffffffffffff924)) + 1;
        }
        in_stack_fffffffffffff920 = in_stack_fffffffffffff928;
        if (8 < in_stack_fffffffffffff928) {
          in_stack_fffffffffffff920 = 8;
        }
        local_26c = in_stack_fffffffffffff924 + in_stack_fffffffffffff920;
        local_268 = in_stack_fffffffffffff928;
        for (local_244 = in_stack_fffffffffffff924; local_244 < local_26c; local_244 = local_244 + 1
            ) {
          local_218 = (long)local_238->hashCache + ((ulong)local_244 - 0x40);
          local_21c = local_264 + 8;
          local_228 = local_230->hashSalt;
          local_220 = local_240;
          in_stack_fffffffffffff918 = (BYTE *)(ulong)(local_240 - 4);
          switch(in_stack_fffffffffffff918) {
          default:
            local_210 = ZSTD_hash4PtrS(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
                                       in_stack_fffffffffffff8f8);
            break;
          case (BYTE *)0x1:
            local_210 = ZSTD_hash5PtrS(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,0x9437db)
            ;
            break;
          case (BYTE *)0x2:
            local_210 = ZSTD_hash6PtrS(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,0x943801)
            ;
            break;
          case (BYTE *)0x3:
            local_210 = ZSTD_hash7PtrS(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,0x943827)
            ;
            break;
          case (BYTE *)0x4:
            local_210 = ZSTD_hash8PtrS(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,0x94384d)
            ;
          }
          local_270 = (uint)local_210;
          local_274 = (local_270 >> 8) << ((byte)local_23c & 0x1f);
          local_1d8 = local_258;
          local_1e0 = local_260;
          local_1e8 = local_23c;
          local_230->hashCache[local_244 & 7] = local_270;
          local_1e4 = local_274;
        }
      }
      local_2d0->lazySkipping = 0;
    }
    while (local_308 <= local_320) {
      UVar4 = (int)local_308 - (int)local_328;
      UVar5 = ZSTD_getLowestMatchIndex(local_2d0,UVar4,local_354);
      uVar7 = UVar4 - local_364;
      in_stack_fffffffffffff910 = local_328;
      if (uVar7 < local_32c) {
        in_stack_fffffffffffff910 = local_340;
      }
      pUVar2 = in_stack_fffffffffffff910->hashCache;
      if ((local_32c - 1) - uVar7 < 3 || UVar4 - UVar5 < local_364) break;
      in_stack_fffffffffffff90c = MEM_read32(local_308);
      UVar4 = MEM_read32((void *)((long)pUVar2 + ((ulong)uVar7 - 0x40)));
      if (in_stack_fffffffffffff90c != UVar4) break;
      in_stack_fffffffffffff900 = local_318;
      if (uVar7 < local_32c) {
        in_stack_fffffffffffff900 = local_348;
      }
      sVar8 = ZSTD_count_2segments
                        (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (BYTE *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         in_stack_fffffffffffff918);
      uVar7 = local_364;
      local_370 = sVar8 + 4;
      local_378 = (ulong)local_364;
      local_364 = local_360;
      local_360 = uVar7;
      local_d0 = local_2d8;
      local_d8 = 0;
      local_e0 = local_310;
      local_e8 = local_318;
      local_ec = 1;
      local_100 = local_318 + -0x20;
      local_108 = local_310;
      local_f8 = local_370;
      if (local_100 < local_310) {
        ZSTD_safecopyLiterals
                  ((BYTE *)in_stack_fffffffffffff910,
                   (BYTE *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   in_stack_fffffffffffff900,
                   (BYTE *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      }
      else {
        ZSTD_copy16((void *)local_2d8[3],local_310);
        if (0x10 < local_d8) {
          local_38 = (void *)(local_d0[3] + 0x10);
          local_30 = local_e0 + 0x10;
          local_18 = local_d8 - 0x10;
          local_1c = 0;
          local_28 = (long)local_38 - (long)local_30;
          local_40 = (void *)((long)local_38 + local_18);
          local_10 = local_30;
          local_8 = local_38;
          ZSTD_copy16(local_38,local_30);
          if (0x10 < local_18) {
            local_38 = (void *)((long)local_38 + 0x10);
            local_30 = local_30 + 0x10;
            do {
              ZSTD_copy16(local_38,local_30);
              local_38 = (void *)((long)local_38 + 0x10);
              local_30 = local_30 + 0x10;
              ZSTD_copy16(local_38,local_30);
              local_38 = (void *)((long)local_38 + 0x10);
              local_30 = local_30 + 0x10;
            } while (local_38 < local_40);
          }
        }
      }
      local_d0[3] = local_d8 + local_d0[3];
      if (0xffff < local_d8) {
        *(undefined4 *)(local_d0 + 9) = 1;
        *(int *)((long)local_d0 + 0x4c) = (int)(local_d0[1] - *local_d0 >> 3);
      }
      *(short *)(local_d0[1] + 4) = (short)local_d8;
      *(undefined4 *)local_d0[1] = local_ec;
      local_110 = local_f8 - 3;
      if (0xffff < local_110) {
        *(undefined4 *)(local_d0 + 9) = 2;
        *(int *)((long)local_d0 + 0x4c) = (int)(local_d0[1] - *local_d0 >> 3);
      }
      *(short *)(local_d0[1] + 6) = (short)local_110;
      local_d0[1] = local_d0[1] + 8;
      local_310 = local_308 + local_370;
      local_308 = local_310;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}